

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_snoop(CHAR_DATA *ch,char *argument)

{
  ulong uVar1;
  bool bVar2;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var3;
  char buf [4608];
  CHAR_DATA *victim;
  DESCRIPTOR_DATA *d;
  char arg [4608];
  CHAR_DATA *in_stack_ffffffffffffdb98;
  char *in_stack_ffffffffffffdba0;
  CHAR_DATA *in_stack_ffffffffffffdba8;
  char *in_stack_ffffffffffffdbb0;
  char *txt;
  char local_2428 [4608];
  CHAR_DATA *local_1228;
  DESCRIPTOR_DATA *local_1220;
  char local_1218;
  int in_stack_ffffffffffffedec;
  long in_stack_ffffffffffffedf0;
  long in_stack_ffffffffffffedf8;
  OBJ_DATA *in_stack_ffffffffffffee00;
  CHAR_DATA *in_stack_ffffffffffffee08;
  char *in_stack_ffffffffffffee10;
  char *in_stack_ffffffffffffffa0;
  CHAR_DATA *in_stack_ffffffffffffffa8;
  
  one_argument(in_stack_ffffffffffffdba0,(char *)in_stack_ffffffffffffdb98);
  if (local_1218 == '\0') {
    send_to_char(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
  }
  else {
    local_1228 = get_char_world(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    if (local_1228 == (CHAR_DATA *)0x0) {
      send_to_char(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
    }
    else if (local_1228->desc == (DESCRIPTOR_DATA *)0x0) {
      send_to_char(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
    }
    else if (local_1228 == in_RDI) {
      send_to_char(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
      get_trust(in_stack_ffffffffffffdb98);
      wiznet(in_stack_ffffffffffffee10,in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
             in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0,in_stack_ffffffffffffedec);
      for (local_1220 = descriptor_list; local_1220 != (DESCRIPTOR_DATA *)0x0;
          local_1220 = local_1220->next) {
        if (local_1220->snoop_by == in_RDI->desc) {
          local_1220->snoop_by = (DESCRIPTOR_DATA *)0x0;
        }
      }
    }
    else if (local_1228->desc->snoop_by == (DESCRIPTOR_DATA *)0x0) {
      uVar1 = local_1228->in_room->room_flags[0];
      _Var3 = std::pow<int,int>(0,0x593014);
      if (((uVar1 & (long)_Var3) == 0) || (0x3b < in_RDI->level)) {
        bVar2 = is_room_owner(in_stack_ffffffffffffdb98,(ROOM_INDEX_DATA *)0x593070);
        if ((bVar2) ||
           (((in_RDI->in_room == local_1228->in_room ||
             (bVar2 = room_is_private(local_1228->in_room), !bVar2)) || (0x3b < in_RDI->level)))) {
          if ((local_1228->level < in_RDI->level) &&
             (uVar1 = local_1228->comm[0], _Var3 = std::pow<int,int>(0,0x593120),
             (uVar1 & (long)_Var3) == 0)) {
            if (in_RDI->desc != (DESCRIPTOR_DATA *)0x0) {
              for (local_1220 = in_RDI->desc->snoop_by; local_1220 != (DESCRIPTOR_DATA *)0x0;
                  local_1220 = local_1220->snoop_by) {
                if ((local_1220->character == local_1228) || (local_1220->original == local_1228)) {
                  send_to_char(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
                  return;
                }
              }
            }
            local_1228->desc->snoop_by = in_RDI->desc;
            bVar2 = is_npc(in_stack_ffffffffffffdb98);
            if (bVar2) {
              txt = local_1228->short_descr;
            }
            else {
              txt = local_1228->name;
            }
            sprintf(local_2428,"$N starts snooping on %s",txt);
            get_trust(in_stack_ffffffffffffdb98);
            wiznet(in_stack_ffffffffffffee10,in_stack_ffffffffffffee08,in_stack_ffffffffffffee00,
                   in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0,in_stack_ffffffffffffedec);
            send_to_char(txt,in_RDI);
          }
          else {
            send_to_char(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
          }
        }
        else {
          send_to_char(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
        }
      }
      else {
        send_to_char(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
      }
    }
    else {
      send_to_char(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
    }
  }
  return;
}

Assistant:

void do_snoop(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	DESCRIPTOR_DATA *d;
	CHAR_DATA *victim;
	char buf[MAX_STRING_LENGTH];

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Snoop whom?\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (victim->desc == nullptr)
	{
		send_to_char("No descriptor to snoop.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("Cancelling all snoops.\n\r", ch);
		wiznet("$N stops being such a snoop.", ch, nullptr, WIZ_SNOOPS, WIZ_SECURE, get_trust(ch));

		for (d = descriptor_list; d != nullptr; d = d->next)
		{
			if (d->snoop_by == ch->desc)
				d->snoop_by = nullptr;
		}

		return;
	}

	if (victim->desc->snoop_by != nullptr)
	{
		send_to_char("Busy already.\n\r", ch);
		return;
	}

	if (IS_SET(victim->in_room->room_flags, ROOM_IMP_ONLY) && ch->level < 60)
	{
		send_to_char("Access denied.\n\r", ch);
		return;
	}

	if (!is_room_owner(ch, victim->in_room)
		&& ch->in_room != victim->in_room
		&& room_is_private(victim->in_room)
		&& ch->level < 60)
	{
		send_to_char("That character is in a private room.\n\r", ch);
		return;
	}

	if (victim->level >= ch->level || IS_SET(victim->comm, COMM_SNOOP_PROOF))
	{
		send_to_char("You failed.\n\r", ch);
		return;
	}

	if (ch->desc != nullptr)
	{
		for (d = ch->desc->snoop_by; d != nullptr; d = d->snoop_by)
		{
			if (d->character == victim || d->original == victim)
			{
				send_to_char("No snoop loops.\n\r", ch);
				return;
			}
		}
	}

	victim->desc->snoop_by = ch->desc;

	sprintf(buf, "$N starts snooping on %s", (is_npc(ch) ? victim->short_descr : victim->name));
	wiznet(buf, ch, nullptr, WIZ_SNOOPS, WIZ_SECURE, get_trust(ch));

	send_to_char("Ok.\n\r", ch);
}